

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportFileGenerator::SetImportLinkProperty<cmLinkItem>
          (cmExportFileGenerator *this,string *suffix,cmGeneratorTarget *target,string *propName,
          vector<cmLinkItem,_std::allocator<cmLinkItem>_> *entries,ImportPropertyMap *properties,
          ImportLinkPropertyTargetNames targetNames)

{
  cmLinkItem *pcVar1;
  cmLocalGenerator *lg;
  string *psVar2;
  mapped_type *pmVar3;
  cmLinkItem *l;
  cmLinkItem *this_00;
  string prop;
  string link_entries;
  string local_70;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  if ((entries->super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>)._M_impl.
      super__Vector_impl_data._M_start !=
      (entries->super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    lg = cmGeneratorTarget::GetLocalGenerator(target);
    local_50 = local_40;
    local_48 = 0;
    local_40[0] = 0;
    pcVar1 = (entries->super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (this_00 = (entries->super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>)._M_impl.
                   super__Vector_impl_data._M_start; this_00 != pcVar1; this_00 = this_00 + 1) {
      std::__cxx11::string::append((char *)&local_50);
      if (targetNames == Yes) {
        psVar2 = cmLinkItem::AsStr_abi_cxx11_(this_00);
        std::__cxx11::string::string((string *)&local_70,(string *)psVar2);
        AddTargetNamespace(this,&local_70,target,lg);
        std::__cxx11::string::append((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
      }
      else {
        cmLinkItem::AsStr_abi_cxx11_(this_00);
        std::__cxx11::string::append((string *)&local_50);
      }
    }
    cmStrCat<std::__cxx11::string_const&,std::__cxx11::string_const&>(&local_70,propName,suffix);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](properties,&local_70);
    std::__cxx11::string::_M_assign((string *)pmVar3);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void cmExportFileGenerator::SetImportLinkProperty(
  std::string const& suffix, cmGeneratorTarget const* target,
  const std::string& propName, std::vector<T> const& entries,
  ImportPropertyMap& properties, ImportLinkPropertyTargetNames targetNames)
{
  // Skip the property if there are no entries.
  if (entries.empty()) {
    return;
  }

  cmLocalGenerator const* lg = target->GetLocalGenerator();

  // Construct the property value.
  std::string link_entries;
  const char* sep = "";
  for (T const& l : entries) {
    // Separate this from the previous entry.
    link_entries += sep;
    sep = ";";

    if (targetNames == ImportLinkPropertyTargetNames::Yes) {
      std::string temp = asString(l);
      this->AddTargetNamespace(temp, target, lg);
      link_entries += temp;
    } else {
      link_entries += asString(l);
    }
  }

  // Store the property.
  std::string prop = cmStrCat(propName, suffix);
  properties[prop] = link_entries;
}